

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

bool cmCacheManager::ParseEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  CacheEntryType CVar5;
  int iVar6;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  if ((ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::reg == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::reg), iVar6 != 0)) {
    ParseEntry::reg.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::reg);
  }
  if ((ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::regQuoted), iVar6 != 0)) {
    ParseEntry::regQuoted.program = (char *)0x0;
    cmsys::RegularExpression::compile
              (&ParseEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntry::regQuoted,&__dso_handle);
    __cxa_guard_release(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::regQuoted);
  }
  bVar4 = cmsys::RegularExpression::find(&ParseEntry::regQuoted,(entry->_M_dataplus)._M_p);
  if (bVar4) {
    if (ParseEntry::regQuoted.startp[1] == (char *)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,ParseEntry::regQuoted.startp[1],ParseEntry::regQuoted.endp[1]);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    local_50 = &local_40;
    if (ParseEntry::regQuoted.startp[2] == (char *)0x0) {
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,ParseEntry::regQuoted.startp[2],ParseEntry::regQuoted.endp[2]);
    }
    CVar5 = cmState::StringToCacheEntryType(local_50);
    *type = CVar5;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (ParseEntry::regQuoted.startp[3] == (char *)0x0) {
      local_48 = 0;
      local_40 = '\0';
      local_50 = &local_40;
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,ParseEntry::regQuoted.startp[3],ParseEntry::regQuoted.endp[3]);
    }
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if (local_50 != &local_40) {
LAB_0033f4af:
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
LAB_0033f4bc:
    bVar4 = true;
  }
  else {
    bVar4 = cmsys::RegularExpression::find(&ParseEntry::reg,(entry->_M_dataplus)._M_p);
    if (bVar4) {
      local_50 = &local_40;
      if (ParseEntry::reg.startp[1] == (char *)0x0) {
        local_48 = 0;
        local_40 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,ParseEntry::reg.startp[1],ParseEntry::reg.endp[1]);
      }
      std::__cxx11::string::operator=((string *)var,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (ParseEntry::reg.startp[2] == (char *)0x0) {
        local_48 = 0;
        local_40 = '\0';
        local_50 = &local_40;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,ParseEntry::reg.startp[2],ParseEntry::reg.endp[2]);
      }
      CVar5 = cmState::StringToCacheEntryType(local_50);
      *type = CVar5;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (ParseEntry::reg.startp[3] == (char *)0x0) {
        local_48 = 0;
        local_40 = '\0';
        local_50 = &local_40;
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,ParseEntry::reg.startp[3],ParseEntry::reg.endp[3]);
      }
      std::__cxx11::string::operator=((string *)value,(string *)&local_50);
      if (local_50 != &local_40) goto LAB_0033f4af;
      goto LAB_0033f4bc;
    }
    bVar4 = false;
  }
  if (bVar4) {
    if (((1 < value->_M_string_length) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
       (pcVar1[value->_M_string_length - 1] == '\'')) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
      std::__cxx11::string::operator=((string *)value,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
    }
    if (bVar4) {
      return true;
    }
  }
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::reg == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::reg), iVar6 != 0)) {
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    reg._184_8_ = 0;
    cmsys::RegularExpression::compile
              ((RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg,&__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::reg);
  }
  if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
       ::regQuoted == '\0') &&
     (iVar6 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                   ::regQuoted), iVar6 != 0)) {
    ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)::
    regQuoted._184_8_ = 0;
    cmsys::RegularExpression::compile
              ((RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted,&__dso_handle);
    __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::regQuoted);
  }
  bVar4 = cmsys::RegularExpression::find
                    ((RegularExpression *)
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::regQuoted,(entry->_M_dataplus)._M_p);
  if (bVar4) {
    if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
        ::regQuoted._8_8_ == 0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted._8_8_,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::regQuoted._88_8_);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    lVar2 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::regQuoted._16_8_;
    uVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::regQuoted._96_8_;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      lVar2 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._16_8_;
      uVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::regQuoted._96_8_;
    }
  }
  else {
    bVar4 = cmsys::RegularExpression::find
                      ((RegularExpression *)
                       ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                       ::reg,(entry->_M_dataplus)._M_p);
    if (!bVar4) {
      bVar4 = false;
      goto LAB_0033f7a7;
    }
    if (ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
        ::reg._8_8_ == 0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg._8_8_,
                 ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                 ::reg._88_8_);
    }
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    lVar2 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::reg._16_8_;
    uVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
            ::reg._96_8_;
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      lVar2 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._16_8_;
      uVar3 = ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
              ::reg._96_8_;
    }
  }
  if (lVar2 == 0) {
    local_50 = &local_40;
    local_48 = 0;
    local_40 = '\0';
  }
  else {
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar2,uVar3);
  }
  std::__cxx11::string::operator=((string *)value,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  bVar4 = true;
LAB_0033f7a7:
  if ((((bVar4 != false) && (1 < value->_M_string_length)) &&
      (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return bVar4;
}

Assistant:

bool cmCacheManager::ParseEntry(const std::string& entry,
                                std::string& var,
                                std::string& value,
                                cmState::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if(regQuoted.find(entry))
    {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2).c_str());
    value = regQuoted.match(3);
    flag = true;
    }
  else if (reg.find(entry))
    {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2).c_str());
    value = reg.match(3);
    flag = true;
    }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag &&
      value.size() >= 2 &&
      value[0] == '\'' &&
      value[value.size() - 1] == '\'')
    {
    value = value.substr(1,
                         value.size() - 2);
    }

  if (!flag)
    {
    return ParseEntryWithoutType(entry, var, value);
    }

  return flag;
}